

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
          (Float<unsigned_long,_11,_52,_1023,_3U> *other)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar3 = other->m_value;
  if ((uVar3 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
    if (((~uVar3 & 0x7ff0000000000000) == 0) && ((uVar3 & 0xfffffffffffff) != 0)) {
      return (Float<unsigned_int,_8,_23,_127,_3U>)0x7fffffff;
    }
    uVar4 = (uint)(uVar3 >> 0x20);
    if ((uVar3 & 0x7fffffffffffffff) == 0) {
      return (Float<unsigned_int,_8,_23,_127,_3U>)uVar4;
    }
    uVar1 = Float<unsigned_long,_11,_52,_1023,_3U>::exponent(other);
    for (uVar3 = Float<unsigned_long,_11,_52,_1023,_3U>::mantissa(other);
        (uVar3 & 0x10000000000000) == 0; uVar3 = uVar3 * 2) {
      uVar1 = uVar1 - 1;
    }
    uVar4 = uVar4 & 0x80000000;
    if ((int)uVar1 < -0x7e) {
      if (0xffffff69 < uVar1) {
        return (Float<unsigned_int,_8,_23,_127,_3U>)
               (uVar4 | (uint)(~(-1L << (0x9eU - (char)uVar1 & 0x3f)) + uVar3 +
                               (ulong)((uVar3 >> ((ulong)(-uVar1 - 0x61) & 0x3f) & 1) != 0) >>
                              ((byte)(-uVar1 - 0x61) & 0x3f)));
      }
      return (Float<unsigned_int,_8,_23,_127,_3U>)
             (*(uint *)((long)&other->m_value + 4) & 0x80000000);
    }
    uVar3 = (uVar3 & 0xffefffffffffffff) + 0xfffffff + (ulong)(((uint)uVar3 >> 0x1d & 1) != 0);
    uVar5 = uVar3 & 0x10000000000000;
    iVar2 = (uint)(uVar5 >> 0x34) + uVar1;
    if (iVar2 < 0x80) {
      uVar1 = (uint)(uVar3 >> 0x1d);
      if (uVar5 != 0) {
        uVar1 = 0;
      }
      return (Float<unsigned_int,_8,_23,_127,_3U>)(uVar1 | uVar4 | iVar2 * 0x800000 + 0x3f800000U);
    }
    uVar3 = other->m_value;
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)((uint)(-1 < (long)uVar3) * -0x80000000 - 0x800000);
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::convert
	(const Float<OtherStorageType, OtherExponentBits, OtherMantissaBits, OtherExponentBias, OtherFlags>& other)
{
	if (!(Flags & FLOAT_HAS_SIGN) && other.sign() < 0)
	{
		// Negative number, truncate to zero.
		return zero(+1);
	}
	else if (other.isInf())
	{
		return inf(other.sign());
	}
	else if (other.isNaN())
	{
		return nan();
	}
	else if (other.isZero())
	{
		return zero(other.sign());
	}
	else
	{
		const int			eMin	= 1 - ExponentBias;
		const int			eMax	= ((1<<ExponentBits)-2) - ExponentBias;

		const StorageType	s		= StorageType((StorageType(other.signBit())) << (StorageType(ExponentBits+MantissaBits))); // \note Not sign, but sign bit.
		int					e		= other.exponent();
		deUint64			m		= other.mantissa();

		// Normalize denormalized values prior to conversion.
		while (!(m & (1ull<<OtherMantissaBits)))
		{
			m <<= 1;
			e  -= 1;
		}

		if (e < eMin)
		{
			// Underflow.
			if ((Flags & FLOAT_SUPPORT_DENORM) && (eMin-e-1 <= MantissaBits))
			{
				// Shift and round (RTE).
				int			bitDiff	= (OtherMantissaBits-MantissaBits) + (eMin-e);
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				return Float(StorageType(s | (m + half + bias) >> bitDiff));
			}
			else
				return zero(other.sign());
		}
		else
		{
			// Remove leading 1.
			m = m & ~(1ull<<OtherMantissaBits);

			if (MantissaBits < OtherMantissaBits)
			{
				// Round mantissa (round to nearest even).
				int			bitDiff	= OtherMantissaBits-MantissaBits;
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				m = (m + half + bias) >> bitDiff;

				if (m & (1ull<<MantissaBits))
				{
					// Overflow in mantissa.
					m  = 0;
					e += 1;
				}
			}
			else
			{
				int bitDiff = MantissaBits-OtherMantissaBits;
				m = m << bitDiff;
			}

			if (e > eMax)
			{
				// Overflow.
				return inf(other.sign());
			}
			else
			{
				DE_ASSERT(de::inRange(e, eMin, eMax));
				DE_ASSERT(((e + ExponentBias) & ~((1ull<<ExponentBits)-1)) == 0);
				DE_ASSERT((m & ~((1ull<<MantissaBits)-1)) == 0);

				return Float(StorageType(s | (StorageType(e + ExponentBias) << MantissaBits) | m));
			}
		}
	}
}